

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsaStream_SetUpBuffers(PaAlsaStream *self,unsigned_long *numFrames,int *xrunOccurred)

{
  int iVar1;
  char *format;
  PaError PVar2;
  unsigned_long frameCount;
  int xrun;
  unsigned_long playbackFrames;
  unsigned_long captureFrames;
  int local_44;
  unsigned_long local_40;
  unsigned_long local_38;
  
  local_38 = 0xffffffffffffffff;
  local_40 = 0xffffffffffffffff;
  local_44 = 0;
  if (*xrunOccurred != 0) {
    *numFrames = 0;
    return 0;
  }
  iVar1 = (self->capture).ready;
  if ((iVar1 == 0) && ((self->playback).ready == 0)) {
    PaUtil_DebugPrint(
                     "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4069\n"
                     );
    PVar2 = -0x2702;
    goto LAB_0010f023;
  }
  if ((iVar1 != 0) && ((self->capture).pcm != (snd_pcm_t *)0x0)) {
    local_38 = *numFrames;
    paUtilErr_ = PaAlsaStreamComponent_RegisterChannels
                           (&self->capture,&self->bufferProcessor,&local_38,&local_44);
    if (-1 < paUtilErr_) goto LAB_0010efbb;
    format = 
    "Expression \'PaAlsaStreamComponent_RegisterChannels( &self->capture, &self->bufferProcessor, &captureFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4078\n"
    ;
LAB_0010f11a:
    PaUtil_DebugPrint(format);
    PVar2 = paUtilErr_;
    goto LAB_0010f023;
  }
LAB_0010efbb:
  if (((self->playback).pcm != (snd_pcm_t *)0x0) && ((self->playback).ready != 0)) {
    local_40 = *numFrames;
    paUtilErr_ = PaAlsaStreamComponent_RegisterChannels
                           (&self->playback,&self->bufferProcessor,&local_40,&local_44);
    if (paUtilErr_ < 0) {
      format = 
      "Expression \'PaAlsaStreamComponent_RegisterChannels( &self->playback, &self->bufferProcessor, &playbackFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4084\n"
      ;
      goto LAB_0010f11a;
    }
  }
  if (local_44 == 0) {
    frameCount = local_40;
    if (local_38 < local_40) {
      frameCount = local_38;
    }
    if (*numFrames < frameCount) goto LAB_0010f01d;
    if ((self->capture).pcm != (snd_pcm_t *)0x0) {
      if ((self->capture).ready == 0) {
        PaUtil_SetNoInput(&self->bufferProcessor);
      }
      else {
        PaUtil_SetInputFrameCount(&self->bufferProcessor,frameCount);
      }
    }
    if ((self->playback).pcm != (snd_pcm_t *)0x0) {
      if ((self->playback).ready == 0) {
        if (self->neverDropInput == 0) {
          __assert_fail("self->neverDropInput",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                        ,0x102b,
                        "PaError PaAlsaStream_SetUpBuffers(PaAlsaStream *, unsigned long *, int *)")
          ;
        }
        if ((self->capture).pcm == (snd_pcm_t *)0x0) {
          __assert_fail("self->capture.pcm != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                        ,0x102c,
                        "PaError PaAlsaStream_SetUpBuffers(PaAlsaStream *, unsigned long *, int *)")
          ;
        }
        PaUtil_SetNoOutput(&self->bufferProcessor);
      }
      else {
        PaUtil_SetOutputFrameCount(&self->bufferProcessor,frameCount);
      }
    }
  }
  else {
LAB_0010f01d:
    frameCount = 0;
  }
  *numFrames = frameCount;
  PVar2 = 0;
LAB_0010f023:
  iVar1 = local_44;
  if (local_44 != 0) {
    paUtilErr_ = PaAlsaStream_HandleXrun(self);
    while (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4151\n"
                       );
      PVar2 = paUtilErr_;
      if (iVar1 == 0) goto LAB_0010f048;
      paUtilErr_ = PaAlsaStream_HandleXrun(self);
    }
    *numFrames = 0;
  }
LAB_0010f048:
  *xrunOccurred = iVar1;
  return PVar2;
}

Assistant:

static PaError PaAlsaStream_SetUpBuffers( PaAlsaStream* self, unsigned long* numFrames, int* xrunOccurred )
{
    PaError result = paNoError;
    unsigned long captureFrames = ULONG_MAX, playbackFrames = ULONG_MAX, commonFrames = 0;
    int xrun = 0;

    if( *xrunOccurred )
    {
        *numFrames = 0;
        return result;
    }
    /* If we got here at least one of the pcm's should be marked ready */
    PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );

    /* Extract per-channel ALSA buffer pointers and register them with the buffer processor.
     * It is possible that a direction is not marked ready however, because it is out of sync with the other.
     */
    if( self->capture.pcm && self->capture.ready )
    {
        captureFrames = *numFrames;
        PA_ENSURE( PaAlsaStreamComponent_RegisterChannels( &self->capture, &self->bufferProcessor, &captureFrames,
                    &xrun ) );
    }
    if( self->playback.pcm && self->playback.ready )
    {
        playbackFrames = *numFrames;
        PA_ENSURE( PaAlsaStreamComponent_RegisterChannels( &self->playback, &self->bufferProcessor, &playbackFrames,
                    &xrun ) );
    }
    if( xrun )
    {
        /* Nothing more to do */
        assert( 0 == commonFrames );
        goto end;
    }

    commonFrames = PA_MIN( captureFrames, playbackFrames );
    /* assert( commonFrames <= *numFrames ); */
    if( commonFrames > *numFrames )
    {
        /* Hmmm ... how come there are more frames available than we requested!? Blah. */
        PA_DEBUG(( "%s: Common available frames are reported to be more than number requested: %lu, %lu, callbackMode: %d\n", __FUNCTION__,
                    commonFrames, *numFrames, self->callbackMode ));
        if( self->capture.pcm )
        {
            PA_DEBUG(( "%s: captureFrames: %lu, capture.ready: %d\n", __FUNCTION__, captureFrames, self->capture.ready ));
        }
        if( self->playback.pcm )
        {
            PA_DEBUG(( "%s: playbackFrames: %lu, playback.ready: %d\n", __FUNCTION__, playbackFrames, self->playback.ready ));
        }

        commonFrames = 0;
        goto end;
    }

    /* Inform PortAudio of the number of frames we got.
     * @concern FullDuplex We might be experiencing underflow in either end; if its an input underflow, we go on
     * with output. If its output underflow however, depending on the paNeverDropInput flag, we may want to simply
     * discard the excess input or call the callback with paOutputOverflow flagged.
     */
    if( self->capture.pcm )
    {
        if( self->capture.ready )
        {
            PaUtil_SetInputFrameCount( &self->bufferProcessor, commonFrames );
        }
        else
        {
            /* We have input underflow */
            PaUtil_SetNoInput( &self->bufferProcessor );
        }
    }
    if( self->playback.pcm )
    {
        if( self->playback.ready )
        {
            PaUtil_SetOutputFrameCount( &self->bufferProcessor, commonFrames );
        }
        else
        {
            /* We have output underflow, but keeping input data (paNeverDropInput) */
            assert( self->neverDropInput );
            assert( self->capture.pcm != NULL );
            PA_DEBUG(( "%s: Setting output buffers to NULL\n", __FUNCTION__ ));
            PaUtil_SetNoOutput( &self->bufferProcessor );
        }
    }

end:
    *numFrames = commonFrames;
error:
    if( xrun )
    {
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *numFrames = 0;
    }
    *xrunOccurred = xrun;

    return result;
}